

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleInequality
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SERecurrentNode *rhs)

{
  long *plVar1;
  ScalarEvolutionAnalysis *pSVar2;
  SExpression rhs_00;
  LoopPeelingInfo *this_00;
  bool bVar3;
  int iVar4;
  SENode *operand;
  SENode *pSVar5;
  SENode *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  ulong uVar8;
  LoopPeelingInfo *this_01;
  ulong uVar9;
  SExpression SVar10;
  SExpression lhs_00;
  SExpression lhs_01;
  bool current_iteration;
  bool first_iteration;
  pair<spvtools::opt::SExpression,_long> flip_iteration;
  bool local_7d;
  CmpOperator local_7c;
  SENode *local_78;
  ScalarEvolutionAnalysis *local_70;
  SENode *local_68;
  LoopPeelingInfo *local_60;
  SExpression local_58;
  pair<spvtools::opt::SExpression,_long> local_48;
  
  lhs_00.scev_ = lhs.scev_;
  pSVar6 = rhs->offset_;
  local_7c = cmp_op;
  local_60 = this;
  operand = ScalarEvolutionAnalysis::SimplifyExpression(pSVar6->parent_analysis_,pSVar6);
  local_70 = pSVar6->parent_analysis_;
  pSVar6 = rhs->coefficient_;
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar6->parent_analysis_,pSVar6);
  pSVar2 = pSVar6->parent_analysis_;
  local_78 = operand;
  pSVar6 = ScalarEvolutionAnalysis::CreateNegation(lhs_00.scev_,operand);
  local_68 = lhs.node_;
  pSVar6 = ScalarEvolutionAnalysis::CreateAddNode(lhs_00.scev_,lhs.node_,pSVar6);
  local_58.node_ = ScalarEvolutionAnalysis::SimplifyExpression(pSVar6->parent_analysis_,pSVar6);
  local_58.scev_ = pSVar6->parent_analysis_;
  SVar10.scev_ = pSVar2;
  SVar10.node_ = pSVar5;
  SExpression::operator/(&local_48,&local_58,SVar10);
  iVar4 = (*(local_48.first.node_)->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar4) != 0) {
    iVar4 = (*(local_48.first.node_)->_vptr_SENode[4])();
    this_00 = local_60;
    pSVar6 = local_68;
    plVar1 = (long *)(CONCAT44(extraout_var_00,iVar4) + 0x30);
    uVar8 = (ulong)(local_48.second != 0) + *plVar1;
    if ((uVar8 != 0 && SCARRY8((ulong)(local_48.second != 0),*plVar1) == (long)uVar8 < 0) &&
       (uVar8 < local_60->loop_max_iterations_)) {
      if ((local_7c & ~kGT) == kLE && local_48.second == 0) {
        rhs_00.scev_ = local_70;
        rhs_00.node_ = local_78;
        lhs_00.node_ = local_68;
        this_01 = local_60;
        bVar3 = EvalOperator(local_60,local_7c,lhs_00,rhs_00,(bool *)&local_58);
        if (bVar3) {
          SVar10 = GetValueAtIteration(this_01,rhs,uVar8);
          lhs_01.scev_ = lhs_00.scev_;
          lhs_01.node_ = pSVar6;
          bVar3 = EvalOperator(this_00,local_7c,lhs_01,SVar10,&local_7d);
          if (!bVar3) goto LAB_00250bf5;
          uVar8 = uVar8 + ((bool)(char)local_58.node_ == local_7d);
          bVar3 = true;
        }
        else {
LAB_00250bf5:
          bVar3 = false;
        }
        if (bVar3) goto LAB_00250bfb;
      }
      else {
LAB_00250bfb:
        uVar7 = (uint)uVar8;
        if (0xfffffffe < uVar8) {
          uVar7 = 0;
        }
        if (uVar7 != 0) {
          uVar9 = this_00->loop_max_iterations_;
          uVar8 = 1;
          if ((ulong)uVar7 < uVar9 >> 1) {
            uVar9 = (ulong)uVar7;
          }
          else {
            uVar9 = (ulong)((int)uVar9 - uVar7);
            uVar8 = 2;
          }
          goto LAB_00250bdc;
        }
      }
      uVar9 = 0;
      uVar8 = 0;
      goto LAB_00250bdc;
    }
  }
  uVar8 = 0;
  uVar9 = 0;
LAB_00250bdc:
  return (Direction)(uVar9 << 0x20 | uVar8);
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleInequality(CmpOperator cmp_op,
                                                   SExpression lhs,
                                                   SERecurrentNode* rhs) const {
  SExpression offset = rhs->GetOffset();
  SExpression coefficient = rhs->GetCoefficient();
  // Compute (cst - B) / A.
  std::pair<SExpression, int64_t> flip_iteration = (lhs - offset) / coefficient;
  if (!flip_iteration.first->AsSEConstantNode()) {
    return GetNoneDirection();
  }
  // note: !!flip_iteration.second normalize to 0/1 (via bool cast).
  int64_t iteration =
      flip_iteration.first->AsSEConstantNode()->FoldToSingleValue() +
      !!flip_iteration.second;
  if (iteration <= 0 ||
      loop_max_iterations_ <= static_cast<uint64_t>(iteration)) {
    // Always true or false within the loop bounds.
    return GetNoneDirection();
  }
  // If this is a <= or >= operator and the iteration, make sure |iteration| is
  // the one flipping the condition.
  // If (cst - B) and A are not divisible, this equivalent to a < or > check, so
  // we skip this test.
  if (!flip_iteration.second &&
      (cmp_op == CmpOperator::kLE || cmp_op == CmpOperator::kGE)) {
    bool first_iteration;
    bool current_iteration;
    if (!EvalOperator(cmp_op, lhs, offset, &first_iteration) ||
        !EvalOperator(cmp_op, lhs, GetValueAtIteration(rhs, iteration),
                      &current_iteration)) {
      return GetNoneDirection();
    }
    // If the condition did not flip the next will.
    if (first_iteration == current_iteration) {
      iteration++;
    }
  }

  uint32_t cast_iteration = 0;
  // Integrity check: can we fit |iteration| in a uint32_t ?
  if (static_cast<uint64_t>(iteration) < std::numeric_limits<uint32_t>::max()) {
    cast_iteration = static_cast<uint32_t>(iteration);
  }

  if (cast_iteration) {
    // Peel before if we are closer to the start, after if closer to the end.
    if (loop_max_iterations_ / 2 > cast_iteration) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, cast_iteration};
    } else {
      return Direction{
          LoopPeelingPass::PeelDirection::kAfter,
          static_cast<uint32_t>(loop_max_iterations_ - cast_iteration)};
    }
  }

  return GetNoneDirection();
}